

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EncodeOrDecode
          (CommandLineInterface *this,DescriptorPool *pool)

{
  bool bVar1;
  int iVar2;
  Descriptor *type;
  Message *pMVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  long lVar5;
  bool bVar6;
  char *pcVar7;
  ErrorPrinter error_collector;
  Parser parser;
  FileInputStream in;
  FileOutputStream out;
  DynamicMessageFactory dynamic_factory;
  MultiFileErrorCollector local_178;
  ErrorCollector local_170;
  ErrorCollector local_168;
  ErrorFormat local_160;
  undefined8 local_158;
  undefined1 local_150;
  Parser local_148;
  FileInputStream local_120;
  FileOutputStream local_c8;
  DynamicMessageFactory local_78;
  MessageLite *this_00;
  
  type = DescriptorPool::FindMessageTypeByName(pool,&this->codec_type_);
  if (type == (Descriptor *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Type not defined: ",0x12);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->codec_type_)._M_dataplus._M_p,
                        (this->codec_type_)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    return false;
  }
  DynamicMessageFactory::DynamicMessageFactory(&local_78,pool);
  pMVar3 = DynamicMessageFactory::GetPrototype(&local_78,type);
  iVar2 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])(pMVar3);
  this_00 = (MessageLite *)CONCAT44(extraout_var,iVar2);
  io::FileInputStream::FileInputStream(&local_120,0,-1);
  io::FileOutputStream::FileOutputStream(&local_c8,1,-1);
  if (this->mode_ == MODE_ENCODE) {
    local_160 = this->error_format_;
    local_178._vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_0046c648;
    local_170._vptr_ErrorCollector = (_func_int **)&DAT_0046c698;
    local_168._vptr_ErrorCollector = (_func_int **)&PTR__ErrorPrinter_0046c6c8;
    local_158 = 0;
    local_150 = 0;
    TextFormat::Parser::Parser(&local_148);
    local_148.allow_partial_ = true;
    local_148.error_collector_ = &local_170;
    bVar1 = TextFormat::Parser::Parse
                      (&local_148,&local_120.super_ZeroCopyInputStream,(Message *)this_00);
    if (bVar1) {
      TextFormat::Parser::~Parser(&local_148);
      DescriptorPool::ErrorCollector::~ErrorCollector(&local_168);
      io::ErrorCollector::~ErrorCollector(&local_170);
      MultiFileErrorCollector::~MultiFileErrorCollector(&local_178);
LAB_00225226:
      iVar2 = (*this_00->_vptr_MessageLite[8])(this_00);
      if ((char)iVar2 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"warning:  Input message is missing required fields:  ",
                   0x35);
        (*this_00->_vptr_MessageLite[9])(&local_178,this_00);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_178._vptr_MultiFileErrorCollector,
                            (long)local_170._vptr_ErrorCollector);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if ((ErrorCollector *)local_178._vptr_MultiFileErrorCollector != &local_168) {
          operator_delete(local_178._vptr_MultiFileErrorCollector);
        }
      }
      if (this->mode_ == MODE_ENCODE) {
        bVar1 = MessageLite::SerializePartialToZeroCopyStream
                          (this_00,&local_c8.super_ZeroCopyOutputStream);
      }
      else {
        bVar1 = TextFormat::Print((Message *)this_00,&local_c8.super_ZeroCopyOutputStream);
      }
      bVar6 = true;
      if (bVar1 != false) goto LAB_00225324;
      lVar5 = 0x12;
      pcVar7 = "output: I/O error.";
      goto LAB_002252e8;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to parse input.",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    TextFormat::Parser::~Parser(&local_148);
    DescriptorPool::ErrorCollector::~ErrorCollector(&local_168);
    io::ErrorCollector::~ErrorCollector(&local_170);
    MultiFileErrorCollector::~MultiFileErrorCollector(&local_178);
    if (bVar1) goto LAB_00225226;
  }
  else {
    bVar1 = MessageLite::ParsePartialFromZeroCopyStream
                      (this_00,&local_120.super_ZeroCopyInputStream);
    if (bVar1) goto LAB_00225226;
    lVar5 = 0x16;
    pcVar7 = "Failed to parse input.";
LAB_002252e8:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar5);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  bVar6 = false;
LAB_00225324:
  io::FileOutputStream::~FileOutputStream(&local_c8);
  local_120.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream =
       (_func_int **)&PTR__FileInputStream_00471150;
  io::CopyingInputStreamAdaptor::~CopyingInputStreamAdaptor(&local_120.impl_);
  io::FileInputStream::CopyingFileInputStream::~CopyingFileInputStream(&local_120.copying_input_);
  if (this_00 != (MessageLite *)0x0) {
    (*this_00->_vptr_MessageLite[1])(this_00);
  }
  DynamicMessageFactory::~DynamicMessageFactory(&local_78);
  return bVar6;
}

Assistant:

bool CommandLineInterface::EncodeOrDecode(const DescriptorPool* pool) {
  // Look up the type.
  const Descriptor* type = pool->FindMessageTypeByName(codec_type_);
  if (type == NULL) {
    std::cerr << "Type not defined: " << codec_type_ << std::endl;
    return false;
  }

  DynamicMessageFactory dynamic_factory(pool);
  std::unique_ptr<Message> message(dynamic_factory.GetPrototype(type)->New());

  if (mode_ == MODE_ENCODE) {
    SetFdToTextMode(STDIN_FILENO);
    SetFdToBinaryMode(STDOUT_FILENO);
  } else {
    SetFdToBinaryMode(STDIN_FILENO);
    SetFdToTextMode(STDOUT_FILENO);
  }

  io::FileInputStream in(STDIN_FILENO);
  io::FileOutputStream out(STDOUT_FILENO);

  if (mode_ == MODE_ENCODE) {
    // Input is text.
    ErrorPrinter error_collector(error_format_);
    TextFormat::Parser parser;
    parser.RecordErrorsTo(&error_collector);
    parser.AllowPartialMessage(true);

    if (!parser.Parse(&in, message.get())) {
      std::cerr << "Failed to parse input." << std::endl;
      return false;
    }
  } else {
    // Input is binary.
    if (!message->ParsePartialFromZeroCopyStream(&in)) {
      std::cerr << "Failed to parse input." << std::endl;
      return false;
    }
  }

  if (!message->IsInitialized()) {
    std::cerr << "warning:  Input message is missing required fields:  "
              << message->InitializationErrorString() << std::endl;
  }

  if (mode_ == MODE_ENCODE) {
    // Output is binary.
    if (!message->SerializePartialToZeroCopyStream(&out)) {
      std::cerr << "output: I/O error." << std::endl;
      return false;
    }
  } else {
    // Output is text.
    if (!TextFormat::Print(*message, &out)) {
      std::cerr << "output: I/O error." << std::endl;
      return false;
    }
  }

  return true;
}